

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
::get_number<int,false>
          (binary_reader<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
           *this,input_format_t format,int *result)

{
  undefined8 uVar1;
  int *piVar2;
  bool bVar3;
  reference pvVar4;
  int *piVar5;
  ulong local_38;
  size_t i;
  int *piStack_28;
  array<unsigned_char,_4UL> vec;
  int *result_local;
  input_format_t format_local;
  binary_reader<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *this_local;
  
  piStack_28 = result;
  memset((void *)((long)&i + 4),0,4);
  local_38 = 0;
  while( true ) {
    piVar2 = piStack_28;
    if (3 < local_38) {
      piVar5 = (int *)std::array<unsigned_char,_4UL>::data
                                ((array<unsigned_char,_4UL> *)((long)&i + 4));
      *piVar2 = *piVar5;
      return true;
    }
    binary_reader<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::get((binary_reader<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *)this);
    bVar3 = binary_reader<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::unexpect_eof((binary_reader<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                            *)this,format,"number");
    if (((bVar3 ^ 0xffU) & 1) != 0) break;
    if (((byte)this[0x20] & 1) == 0) {
      uVar1 = *(undefined8 *)(this + 0x10);
      pvVar4 = std::array<unsigned_char,_4UL>::operator[]
                         ((array<unsigned_char,_4UL> *)((long)&i + 4),local_38);
      *pvVar4 = (value_type_conflict)uVar1;
    }
    else {
      uVar1 = *(undefined8 *)(this + 0x10);
      pvVar4 = std::array<unsigned_char,_4UL>::operator[]
                         ((array<unsigned_char,_4UL> *)((long)&i + 4),3 - local_38);
      *pvVar4 = (value_type_conflict)uVar1;
    }
    local_38 = local_38 + 1;
  }
  return false;
}

Assistant:

bool get_number(const input_format_t format, NumberType& result)
    {
        // step 1: read input into array with system's byte order
        std::array<std::uint8_t, sizeof(NumberType)> vec{};
        for (std::size_t i = 0; i < sizeof(NumberType); ++i)
        {
            get();
            if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(format, "number")))
            {
                return false;
            }

            // reverse byte order prior to conversion if necessary
            if (is_little_endian != InputIsLittleEndian)
            {
                vec[sizeof(NumberType) - i - 1] = static_cast<std::uint8_t>(current);
            }
            else
            {
                vec[i] = static_cast<std::uint8_t>(current); // LCOV_EXCL_LINE
            }
        }

        // step 2: convert array into number of type T and return
        std::memcpy(&result, vec.data(), sizeof(NumberType));
        return true;
    }